

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall icu_63::RuleBasedNumberFormat::initDefaultRuleSet(RuleBasedNumberFormat *this)

{
  UBool UVar1;
  NFRuleSet **ppNVar2;
  NFRuleSet **local_100;
  NFRuleSet **p;
  undefined1 local_f0 [8];
  UnicodeString duration;
  undefined1 local_a8 [8];
  UnicodeString ordinal;
  ConstChar16Ptr local_58;
  undefined1 local_50 [8];
  UnicodeString spellout;
  RuleBasedNumberFormat *this_local;
  
  this->defaultRuleSet = (NFRuleSet *)0x0;
  if (this->fRuleSets != (NFRuleSet **)0x0) {
    spellout.fUnion._48_8_ = this;
    ConstChar16Ptr::ConstChar16Ptr(&local_58,L"%spellout-numbering");
    UnicodeString::UnicodeString((UnicodeString *)local_50,'\x01',&local_58,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_58);
    ConstChar16Ptr::ConstChar16Ptr
              ((ConstChar16Ptr *)((long)&duration.fUnion + 0x30),L"%digits-ordinal");
    UnicodeString::UnicodeString
              ((UnicodeString *)local_a8,'\x01',(ConstChar16Ptr *)((long)&duration.fUnion + 0x30),-1
              );
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&duration.fUnion + 0x30));
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&p,L"%duration");
    UnicodeString::UnicodeString((UnicodeString *)local_f0,'\x01',(ConstChar16Ptr *)&p,-1);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&p);
    for (local_100 = this->fRuleSets; *local_100 != (NFRuleSet *)0x0; local_100 = local_100 + 1) {
      UVar1 = NFRuleSet::isNamed(*local_100,(UnicodeString *)local_50);
      if (((UVar1 != '\0') ||
          (UVar1 = NFRuleSet::isNamed(*local_100,(UnicodeString *)local_a8), UVar1 != '\0')) ||
         (UVar1 = NFRuleSet::isNamed(*local_100,(UnicodeString *)local_f0), UVar1 != '\0')) {
        this->defaultRuleSet = *local_100;
        goto LAB_00267196;
      }
    }
    this->defaultRuleSet = local_100[-1];
    UVar1 = NFRuleSet::isPublic(this->defaultRuleSet);
    local_100 = local_100 + -1;
    if (UVar1 == '\0') {
      do {
        if (local_100 == this->fRuleSets) goto LAB_00267196;
        ppNVar2 = local_100 + -1;
        UVar1 = NFRuleSet::isPublic(local_100[-1]);
        local_100 = ppNVar2;
      } while (UVar1 == '\0');
      this->defaultRuleSet = *ppNVar2;
    }
LAB_00267196:
    UnicodeString::~UnicodeString((UnicodeString *)local_f0);
    UnicodeString::~UnicodeString((UnicodeString *)local_a8);
    UnicodeString::~UnicodeString((UnicodeString *)local_50);
  }
  return;
}

Assistant:

void 
RuleBasedNumberFormat::initDefaultRuleSet()
{
    defaultRuleSet = NULL;
    if (!fRuleSets) {
        return;
    }

    const UnicodeString spellout(UNICODE_STRING_SIMPLE("%spellout-numbering"));
    const UnicodeString ordinal(UNICODE_STRING_SIMPLE("%digits-ordinal"));
    const UnicodeString duration(UNICODE_STRING_SIMPLE("%duration"));

    NFRuleSet**p = &fRuleSets[0];
    while (*p) {
        if ((*p)->isNamed(spellout) || (*p)->isNamed(ordinal) || (*p)->isNamed(duration)) {
            defaultRuleSet = *p;
            return;
        } else {
            ++p;
        }
    }

    defaultRuleSet = *--p;
    if (!defaultRuleSet->isPublic()) {
        while (p != fRuleSets) {
            if ((*--p)->isPublic()) {
                defaultRuleSet = *p;
                break;
            }
        }
    }
}